

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

int note_dequeue(void *v,nsync_waiter_s *nw)

{
  nsync_time a;
  uint32_t uVar1;
  int iVar2;
  nsync_dll_list_ pnVar3;
  __time_t local_38;
  nsync_time ntime;
  nsync_note n;
  int was_queued;
  nsync_waiter_s *nw_local;
  void *v_local;
  
  nsync_note_notified_deadline_((nsync_note)v);
  nsync_mu_lock((nsync_mu *)((long)v + 0x30));
  uVar1 = atm_load_acq_u32_((nsync_atomic_uint32_ *)((long)v + 0x54));
  if (uVar1 == 0) {
    if (*(int *)((long)v + 0x18) == 0) {
      local_38 = 0x7fffffffffffffff;
      ntime.tv_sec = 999999999;
    }
    else {
      local_38 = *(__time_t *)((long)v + 0x20);
      ntime.tv_sec = *(__time_t *)((long)v + 0x28);
    }
  }
  else {
    local_38 = 0;
    ntime.tv_sec = 0;
  }
  a.tv_nsec = ntime.tv_sec;
  a.tv_sec = local_38;
  iVar2 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
  if (0 < iVar2) {
    pnVar3 = nsync_dll_remove_(*(nsync_dll_list_ *)((long)v + 0x68),&nw->q);
    *(nsync_dll_list_ *)((long)v + 0x68) = pnVar3;
    nw->waiting = 0;
  }
  n._4_4_ = (uint)(0 < iVar2);
  nsync_mu_unlock((nsync_mu *)((long)v + 0x30));
  return n._4_4_;
}

Assistant:

static int note_dequeue (void *v, struct nsync_waiter_s *nw) {
	int was_queued = 0;
	nsync_note n = (nsync_note) v;
	nsync_time ntime;
	nsync_note_notified_deadline_ (n);
	nsync_mu_lock (&n->note_mu);
	ntime = NOTIFIED_TIME (n);
	if (nsync_time_cmp (ntime, nsync_time_zero) > 0) {
		n->waiters = nsync_dll_remove_ (n->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 0);
		was_queued = 1;
	}
	nsync_mu_unlock (&n->note_mu);
	return (was_queued);
}